

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O1

el_action_t ed_prev_history(EditLine *el,wint_t c)

{
  wchar_t *pwVar1;
  wchar_t wVar2;
  el_action_t eVar3;
  el_action_t eVar4;
  
  wVar2 = (el->el_history).eventno;
  (el->el_chared).c_undo.len = -1;
  *(el->el_line).lastchar = L'\0';
  if ((el->el_history).eventno == L'\0') {
    wcsncpy((el->el_history).buf,(el->el_line).buffer,0x400);
    (el->el_history).last =
         (wchar_t *)
         ((long)(el->el_line).lastchar + ((long)(el->el_history).buf - (long)(el->el_line).buffer));
  }
  pwVar1 = &(el->el_history).eventno;
  *pwVar1 = *pwVar1 + (el->el_state).argument;
  eVar3 = hist_get(el);
  eVar4 = '\x04';
  if (eVar3 == '\x06') {
    if ((el->el_map).type == L'\x01') {
      (el->el_history).eventno = wVar2;
    }
    hist_get(el);
    eVar4 = '\t';
  }
  return eVar4;
}

Assistant:

libedit_private el_action_t
/*ARGSUSED*/
ed_prev_history(EditLine *el, wint_t c __attribute__((__unused__)))
{
	char beep = 0;
	int sv_event = el->el_history.eventno;

	el->el_chared.c_undo.len = -1;
	*el->el_line.lastchar = '\0';		/* just in case */

	if (el->el_history.eventno == 0) {	/* save the current buffer
						 * away */
		(void) wcsncpy(el->el_history.buf, el->el_line.buffer,
		    EL_BUFSIZ);
		el->el_history.last = el->el_history.buf +
		    (el->el_line.lastchar - el->el_line.buffer);
	}
	el->el_history.eventno += el->el_state.argument;

	if (hist_get(el) == CC_ERROR) {
		if (el->el_map.type == MAP_VI) {
			el->el_history.eventno = sv_event;
		}
		beep = 1;
		/* el->el_history.eventno was fixed by first call */
		(void) hist_get(el);
	}
	if (beep)
		return CC_REFRESH_BEEP;
	return CC_REFRESH;
}